

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O0

void Gudhi::persistence_matrix::swap
               (RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false>_>_>
                *matrix1,
               RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false>_>_>
               *matrix2)

{
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false>_>_>
  *matrix2_local;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false>_>_>
  *matrix1_local;
  
  swap((Dummy_ru_pairing *)matrix1,(Dummy_ru_pairing *)matrix2);
  swap((Dummy_ru_vine_swap *)matrix1,(Dummy_ru_vine_swap *)matrix2);
  swap(&matrix1->super_RU_representative_cycles_option,
       &matrix2->super_RU_representative_cycles_option);
  swap(&matrix1->reducedMatrixR_,&matrix2->reducedMatrixR_);
  swap(&matrix1->mirrorMatrixU_,&matrix2->mirrorMatrixU_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::swap
            (&matrix1->pivotToColumnIndex_,&matrix2->pivotToColumnIndex_);
  std::swap<unsigned_int>(&matrix1->nextEventIndex_,&matrix2->nextEventIndex_);
  std::swap<Gudhi::persistence_fields::Z2_field_operators*>
            (&matrix1->operators_,&matrix2->operators_);
  return;
}

Assistant:

void swap(RU_matrix& matrix1, RU_matrix& matrix2) {
    swap(static_cast<typename Master_matrix::RU_pairing_option&>(matrix1),
         static_cast<typename Master_matrix::RU_pairing_option&>(matrix2));
    swap(static_cast<typename Master_matrix::RU_vine_swap_option&>(matrix1),
         static_cast<typename Master_matrix::RU_vine_swap_option&>(matrix2));
    swap(static_cast<typename Master_matrix::RU_representative_cycles_option&>(matrix1),
         static_cast<typename Master_matrix::RU_representative_cycles_option&>(matrix2));
    swap(matrix1.reducedMatrixR_, matrix2.reducedMatrixR_);
    swap(matrix1.mirrorMatrixU_, matrix2.mirrorMatrixU_);
    matrix1.pivotToColumnIndex_.swap(matrix2.pivotToColumnIndex_);
    std::swap(matrix1.nextEventIndex_, matrix2.nextEventIndex_);
    std::swap(matrix1.operators_, matrix2.operators_);
  }